

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O1

void __thiscall
btAxisSweep3Internal<unsigned_int>::calculateOverlappingPairs
          (btAxisSweep3Internal<unsigned_int> *this,btDispatcher *dispatcher)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  btBroadphasePair *pbVar9;
  btBroadphaseProxy *pbVar10;
  btBroadphaseProxy *pbVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  ulong uVar16;
  int iVar17;
  btAlignedObjectArray<btBroadphasePair> *this_00;
  btBroadphasePair *pbVar18;
  long lVar19;
  ulong uVar20;
  Handle *pHandleB;
  btBroadphaseProxy *pbVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  Handle *pHandleA;
  btBroadphaseProxy *pbVar25;
  btBroadphasePairSortPredicate local_3a;
  btBroadphasePairSortPredicate local_39;
  btDispatcher *local_38;
  undefined4 extraout_var;
  
  local_38 = dispatcher;
  iVar17 = (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
             [0xe])();
  if ((char)iVar17 != '\0') {
    iVar17 = (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
               [7])();
    this_00 = (btAlignedObjectArray<btBroadphasePair> *)CONCAT44(extraout_var,iVar17);
    if (1 < this_00->m_size) {
      btAlignedObjectArray<btBroadphasePair>::quickSortInternal<btBroadphasePairSortPredicate>
                (this_00,&local_39,0,this_00->m_size + -1);
    }
    iVar17 = this_00->m_size;
    iVar5 = this->m_invalidPair;
    lVar24 = (long)iVar5;
    lVar23 = iVar17 - lVar24;
    iVar22 = (int)lVar23;
    if ((lVar24 < 1) && (iVar5 < 0)) {
      if (this_00->m_capacity < iVar22) {
        if (iVar17 == iVar5) {
          pbVar18 = (btBroadphasePair *)0x0;
        }
        else {
          pbVar18 = (btBroadphasePair *)btAlignedAllocInternal(lVar23 * 0x20,0x10);
        }
        iVar6 = this_00->m_size;
        if (0 < (long)iVar6) {
          lVar19 = 0;
          do {
            pbVar9 = this_00->m_data;
            puVar1 = (undefined4 *)((long)&pbVar9->m_pProxy0 + lVar19);
            uVar12 = puVar1[1];
            uVar13 = puVar1[2];
            uVar14 = puVar1[3];
            puVar2 = (undefined4 *)((long)&pbVar18->m_pProxy0 + lVar19);
            *puVar2 = *puVar1;
            puVar2[1] = uVar12;
            puVar2[2] = uVar13;
            puVar2[3] = uVar14;
            *(undefined8 *)((long)&pbVar18->m_algorithm + lVar19) =
                 *(undefined8 *)((long)&pbVar9->m_algorithm + lVar19);
            *(undefined8 *)((long)&pbVar18->field_3 + lVar19) =
                 *(undefined8 *)((long)&pbVar9->field_3 + lVar19);
            lVar19 = lVar19 + 0x20;
          } while ((long)iVar6 * 0x20 != lVar19);
        }
        if (this_00->m_data != (btBroadphasePair *)0x0) {
          if (this_00->m_ownsMemory == true) {
            btAlignedFreeInternal(this_00->m_data);
          }
          this_00->m_data = (btBroadphasePair *)0x0;
        }
        this_00->m_ownsMemory = true;
        this_00->m_data = pbVar18;
        this_00->m_capacity = iVar22;
      }
      if (iVar5 < 0) {
        lVar19 = (long)iVar17 << 5;
        do {
          pbVar18 = this_00->m_data;
          puVar4 = (undefined8 *)((long)&pbVar18->m_algorithm + lVar19);
          *puVar4 = 0;
          puVar4[1] = 0;
          puVar4 = (undefined8 *)((long)&pbVar18->m_pProxy0 + lVar19);
          *puVar4 = 0;
          puVar4[1] = 0;
          lVar19 = lVar19 + 0x20;
          lVar24 = lVar24 + 1;
        } while (lVar24 != 0);
      }
    }
    this_00->m_size = iVar22;
    this->m_invalidPair = 0;
    if (0 < iVar22) {
      lVar24 = 0;
      pbVar21 = (btBroadphaseProxy *)0x0;
      pbVar25 = (btBroadphaseProxy *)0x0;
      do {
        pbVar18 = this_00->m_data;
        pbVar10 = pbVar18[lVar24].m_pProxy0;
        pbVar11 = pbVar18[lVar24].m_pProxy1;
        if (((pbVar21 == pbVar11 && pbVar25 == pbVar10) ||
            (uVar7._0_2_ = pbVar10[1].m_collisionFilterGroup,
            uVar7._2_2_ = pbVar10[1].m_collisionFilterMask, uVar7 < *(uint *)&pbVar11->field_0x3c))
           || (uVar8._0_2_ = pbVar11[1].m_collisionFilterGroup,
              uVar8._2_2_ = pbVar11[1].m_collisionFilterMask, uVar8 < *(uint *)&pbVar10->field_0x3c)
           ) {
LAB_00131beb:
          pbVar18 = pbVar18 + lVar24;
          (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[8])
                    (this->m_pairCache,pbVar18,local_38);
          pbVar18->m_pProxy0 = (btBroadphaseProxy *)0x0;
          pbVar18->m_pProxy1 = (btBroadphaseProxy *)0x0;
          this->m_invalidPair = this->m_invalidPair + 1;
          gOverlappingPairs = gOverlappingPairs + -1;
        }
        else {
          uVar16 = 0;
          do {
            uVar20 = uVar16;
            if ((uVar20 == 2) ||
               ((uint)*(btScalar *)((long)(&pbVar10[1].m_aabbMin + -1) + uVar20 * 4) <
                (uint)pbVar11[1].m_aabbMin.m_floats[uVar20 - 7])) break;
            uVar16 = uVar20 + 1;
          } while ((uint)pbVar10[1].m_aabbMin.m_floats[uVar20 - 7] <=
                   (uint)*(btScalar *)((long)(&pbVar11[1].m_aabbMin + -1) + uVar20 * 4));
          if (uVar20 < 2) goto LAB_00131beb;
        }
        lVar24 = lVar24 + 1;
        lVar23 = (long)this_00->m_size;
        pbVar21 = pbVar11;
        pbVar25 = pbVar10;
      } while (lVar24 < lVar23);
    }
    if (1 < (int)lVar23) {
      btAlignedObjectArray<btBroadphasePair>::quickSortInternal<btBroadphasePairSortPredicate>
                (this_00,&local_3a,0,(int)lVar23 + -1);
    }
    iVar17 = this_00->m_size;
    iVar5 = this->m_invalidPair;
    lVar23 = (long)iVar5;
    lVar24 = iVar17 - lVar23;
    iVar22 = (int)lVar24;
    if ((lVar23 < 1) && (iVar5 < 0)) {
      if (this_00->m_capacity < iVar22) {
        if (iVar17 == iVar5) {
          pbVar18 = (btBroadphasePair *)0x0;
        }
        else {
          pbVar18 = (btBroadphasePair *)btAlignedAllocInternal(lVar24 * 0x20,0x10);
        }
        iVar6 = this_00->m_size;
        if (0 < (long)iVar6) {
          lVar24 = 0;
          do {
            pbVar9 = this_00->m_data;
            puVar4 = (undefined8 *)((long)&pbVar9->m_pProxy0 + lVar24);
            uVar15 = puVar4[1];
            puVar3 = (undefined8 *)((long)&pbVar18->m_pProxy0 + lVar24);
            *puVar3 = *puVar4;
            puVar3[1] = uVar15;
            *(undefined8 *)((long)&pbVar18->m_algorithm + lVar24) =
                 *(undefined8 *)((long)&pbVar9->m_algorithm + lVar24);
            *(undefined8 *)((long)&pbVar18->field_3 + lVar24) =
                 *(undefined8 *)((long)&pbVar9->field_3 + lVar24);
            lVar24 = lVar24 + 0x20;
          } while ((long)iVar6 * 0x20 != lVar24);
        }
        if (this_00->m_data != (btBroadphasePair *)0x0) {
          if (this_00->m_ownsMemory == true) {
            btAlignedFreeInternal(this_00->m_data);
          }
          this_00->m_data = (btBroadphasePair *)0x0;
        }
        this_00->m_ownsMemory = true;
        this_00->m_data = pbVar18;
        this_00->m_capacity = iVar22;
      }
      if (iVar5 < 0) {
        lVar24 = (long)iVar17 << 5;
        do {
          pbVar18 = this_00->m_data;
          puVar4 = (undefined8 *)((long)&pbVar18->m_algorithm + lVar24);
          *puVar4 = 0;
          puVar4[1] = 0;
          puVar4 = (undefined8 *)((long)&pbVar18->m_pProxy0 + lVar24);
          *puVar4 = 0;
          puVar4[1] = 0;
          lVar24 = lVar24 + 0x20;
          lVar23 = lVar23 + 1;
        } while (lVar23 != 0);
      }
    }
    this_00->m_size = iVar22;
    this->m_invalidPair = 0;
  }
  return;
}

Assistant:

void	btAxisSweep3Internal<BP_FP_INT_TYPE>::calculateOverlappingPairs(btDispatcher* dispatcher)
{

	if (m_pairCache->hasDeferredRemoval())
	{
	
		btBroadphasePairArray&	overlappingPairArray = m_pairCache->getOverlappingPairArray();

		//perform a sort, to find duplicates and to sort 'invalid' pairs to the end
		overlappingPairArray.quickSort(btBroadphasePairSortPredicate());

		overlappingPairArray.resize(overlappingPairArray.size() - m_invalidPair);
		m_invalidPair = 0;

		
		int i;

		btBroadphasePair previousPair;
		previousPair.m_pProxy0 = 0;
		previousPair.m_pProxy1 = 0;
		previousPair.m_algorithm = 0;
		
		
		for (i=0;i<overlappingPairArray.size();i++)
		{
		
			btBroadphasePair& pair = overlappingPairArray[i];

			bool isDuplicate = (pair == previousPair);

			previousPair = pair;

			bool needsRemoval = false;

			if (!isDuplicate)
			{
				///important to use an AABB test that is consistent with the broadphase
				bool hasOverlap = testAabbOverlap(pair.m_pProxy0,pair.m_pProxy1);

				if (hasOverlap)
				{
					needsRemoval = false;//callback->processOverlap(pair);
				} else
				{
					needsRemoval = true;
				}
			} else
			{
				//remove duplicate
				needsRemoval = true;
				//should have no algorithm
				btAssert(!pair.m_algorithm);
			}
			
			if (needsRemoval)
			{
				m_pairCache->cleanOverlappingPair(pair,dispatcher);

		//		m_overlappingPairArray.swap(i,m_overlappingPairArray.size()-1);
		//		m_overlappingPairArray.pop_back();
				pair.m_pProxy0 = 0;
				pair.m_pProxy1 = 0;
				m_invalidPair++;
				gOverlappingPairs--;
			} 
			
		}

	///if you don't like to skip the invalid pairs in the array, execute following code:
	#define CLEAN_INVALID_PAIRS 1
	#ifdef CLEAN_INVALID_PAIRS

		//perform a sort, to sort 'invalid' pairs to the end
		overlappingPairArray.quickSort(btBroadphasePairSortPredicate());

		overlappingPairArray.resize(overlappingPairArray.size() - m_invalidPair);
		m_invalidPair = 0;
	#endif//CLEAN_INVALID_PAIRS
		
		//printf("overlappingPairArray.size()=%d\n",overlappingPairArray.size());
	}

}